

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OclLib.cpp
# Opt level: O3

int xmrig::OclLib::init(EVP_PKEY_CTX *ctx)

{
  bool bVar1;
  uint uVar2;
  int iVar3;
  undefined8 in_RAX;
  undefined7 extraout_var;
  EVP_PKEY_CTX *in_RDX;
  char *dst;
  
  if (m_initialized == '\x01') {
    uVar2 = (uint)CONCAT71((int7)((ulong)in_RAX >> 8),m_ready);
  }
  else {
    dst = "libOpenCL.so";
    if (ctx != (EVP_PKEY_CTX *)0x0) {
      dst = (char *)ctx;
    }
    String::copy((String *)&m_loader,(EVP_PKEY_CTX *)dst,in_RDX);
    iVar3 = uv_dlopen(m_loader,&oclLib);
    if (iVar3 == 0) {
      bVar1 = load();
      uVar2 = (uint)CONCAT71(extraout_var,bVar1);
    }
    else {
      uVar2 = 0;
    }
    m_ready = (undefined1)uVar2;
    m_initialized = '\x01';
  }
  return uVar2 & 0xffffff01;
}

Assistant:

bool xmrig::OclLib::init(const char *fileName)
{
    if (!m_initialized) {
        m_loader      = fileName == nullptr ? defaultLoader() : fileName;
        m_ready       = uv_dlopen(m_loader, &oclLib) == 0 && load();
        m_initialized = true;
    }

    return m_ready;
}